

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddSign_Test::TestBody
          (ConfidentialTransactionContext_AddSign_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  reference pvVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  ByteData der_bytes2;
  ByteData der_bytes1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  uint32_t vout;
  Txid txid;
  Script redeem_script;
  ConfidentialTransactionContext ctx;
  value_type *in_stack_fffffffffffffa58;
  undefined5 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa65;
  undefined1 in_stack_fffffffffffffa66;
  undefined1 in_stack_fffffffffffffa67;
  allocator *this_00;
  AssertHelper local_550;
  Message local_548;
  string local_540 [32];
  AssertionResult local_520;
  AssertHelper local_510;
  Message local_508 [2];
  OutPoint local_4f8;
  allocator local_4c9;
  string local_4c8 [32];
  Pubkey local_4a8;
  allocator local_489;
  string local_488 [32];
  Pubkey local_468;
  SignParameter local_450 [124];
  SigHashType local_3d4 [12];
  SignParameter local_3c8 [124];
  SigHashType local_34c [12];
  SignParameter local_340 [120];
  ByteData local_2c8;
  SignParameter local_2b0 [127];
  allocator local_231;
  string local_230 [32];
  ByteData local_210;
  allocator local_1f1;
  string local_1f0 [32];
  ByteData local_1d0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_1b8;
  uint local_1a0;
  allocator local_199;
  string local_198 [32];
  Txid local_178;
  allocator local_151;
  string local_150 [32];
  Script local_130;
  allocator local_e1;
  string local_e0 [32];
  OutPoint local_c0 [4];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,
             "522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae"
             ,&local_151);
  cfd::core::Script::Script(&local_130,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_198,"ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c",&local_199
            );
  cfd::core::Txid::Txid(&local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  local_1a0 = 0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)0x1df571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f0,
             "47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb"
             ,&local_1f1);
  cfd::core::ByteData::ByteData(&local_1d0,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,
             "30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601"
             ,&local_231);
  cfd::core::ByteData::ByteData(&local_210,local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  cfd::core::ByteData::ByteData(&local_2c8);
  cfd::SignParameter::SignParameter(local_2b0,&local_2c8);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::core::ByteData::~ByteData((ByteData *)0x1df684);
  cfd::core::SigHashType::SigHashType(local_34c,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(local_340,&local_210,0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::core::SigHashType::SigHashType(local_3d4,kSigHashAll,false,false);
  cfd::SignParameter::SignParameter(local_3c8,&local_1d0,1,local_3d4);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  cfd::SignParameter::SignParameter(local_450,&local_130);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))),
             in_stack_fffffffffffffa58);
  cfd::SignParameter::~SignParameter
            ((SignParameter *)
             CONCAT17(in_stack_fffffffffffffa67,
                      CONCAT16(in_stack_fffffffffffffa66,
                               CONCAT15(in_stack_fffffffffffffa65,in_stack_fffffffffffffa60))));
  pvVar3 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[]
                     (&local_1b8,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_488,"02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef",
             &local_489);
  cfd::core::Pubkey::Pubkey(&local_468,local_488);
  cfd::SignParameter::SetRelatedPubkey((Pubkey *)pvVar3);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1df7f8);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  pvVar3 = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::operator[]
                     (&local_1b8,2);
  this_00 = &local_4c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4c8,"02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5",this_00)
  ;
  cfd::core::Pubkey::Pubkey(&local_4a8,local_4c8);
  cfd::SignParameter::SetRelatedPubkey((Pubkey *)pvVar3);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1df88e);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    in_stack_fffffffffffffa66 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffa66) {
      cfd::core::OutPoint::OutPoint(&local_4f8,&local_178,local_1a0);
      cfd::ConfidentialTransactionContext::AddSign
                (local_c0,(vector *)&local_4f8,SUB81(&local_1b8,0),true);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1df92b);
    }
  }
  else {
    testing::Message::Message(local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1eb,
               "Expected: ctx.AddSign(OutPoint(txid, vout), signatures, true, true) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_510,local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message((Message *)0x1dfd11);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_520,"ctx.GetHex().c_str()",
             "\"0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000\""
             ,pcVar4,
             "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000"
            );
  std::__cxx11::string::~string(local_540);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_548);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1dfe22);
    testing::internal::AssertHelper::AssertHelper
              (&local_550,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x1ed,pcVar4);
    testing::internal::AssertHelper::operator=(&local_550,&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_550);
    testing::Message::~Message((Message *)0x1dfe6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dfebd);
  cfd::core::ByteData::~ByteData((ByteData *)0x1dfeca);
  cfd::core::ByteData::~ByteData((ByteData *)0x1dfed7);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)this_00);
  cfd::core::Txid::~Txid((Txid *)0x1dfef1);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa66,
                                     CONCAT15(uVar2,in_stack_fffffffffffffa60))));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa66,
                                     CONCAT15(uVar2,in_stack_fffffffffffffa60))));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddSign) {
  // P2wpkhMultisig
  ConfidentialTransactionContext ctx("0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e0740000000000000000000000000000");
  Script redeem_script("522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae");

  Txid txid("ea9d5a9e974af1d167305aa6ee598706d63274e8a40f4f33af97db37a7adde4c");
  uint32_t vout = 0;

  std::vector<SignParameter> signatures;
  ByteData der_bytes1("47ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb");
  ByteData der_bytes2("30440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601");
  signatures.push_back(SignParameter(ByteData()));
  signatures.push_back(SignParameter(der_bytes2, false));
  signatures.push_back(SignParameter(der_bytes1, true));
  signatures.push_back(SignParameter(redeem_script));
  signatures[1].SetRelatedPubkey(Pubkey("02f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef"));
  signatures[2].SetRelatedPubkey(Pubkey("02be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5"));

  EXPECT_NO_THROW(ctx.AddSign(OutPoint(txid, vout), signatures, true, true));

  EXPECT_STREQ(ctx.GetHex().c_str(), "0200000001014cdeada737db97af334f0fa4e87432d6068759eea65a3067d1f14a979e5a9dea0000000000fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e074000000000000000004004730440220297e974e4728c6918cfa61f70cfb53d9b92e8a3b1e257003122bef7aecd500d002205d66d23e694fea18d1895a994f46ebd80474811a7509a67073b324f667dab2a601473044022047ac8e878352d3ebbde1c94ce3a10d057c24175747116f8288e5d794d12d482f0220217f36a485cae903c713331d877c1f64677e3622ad4010726870540656fe9dcb0169522102f56451fc1fd9040652ff9a700cf914ad1df1c8f9e82f3fe96ca01b6cd47293ef2102be61f4350b4ae7544f99649a917f48ba16cf48c983ac1599774958d88ad17ec5210205ffcdde75f262d66ada3dd877c7471f8f8ee9ee24d917c3e18d01cee458bafe53ae0000000000");
}